

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

void __thiscall CLPIStreamInfo::parseStreamCodingInfo(CLPIStreamInfo *this,BitStreamReader *reader)

{
  bool bVar1;
  StreamType stream_coding_type;
  uint uVar2;
  long lVar3;
  
  BitStreamReader::skipBits(reader,8);
  stream_coding_type = BitStreamReader::getBits(reader,8);
  (this->super_M2TSStreamInfo).stream_coding_type = stream_coding_type;
  bVar1 = isVideoStreamType(stream_coding_type);
  if (bVar1) {
    uVar2 = BitStreamReader::getBits(reader,4);
    (this->super_M2TSStreamInfo).video_format = (uint8_t)uVar2;
    uVar2 = BitStreamReader::getBits(reader,4);
    (this->super_M2TSStreamInfo).frame_rate_index = (uint8_t)uVar2;
    uVar2 = BitStreamReader::getBits(reader,4);
    (this->super_M2TSStreamInfo).aspect_ratio_index = (uint8_t)uVar2;
    uVar2 = 0x14;
LAB_001e07de:
    BitStreamReader::skipBits(reader,uVar2);
  }
  else {
    bVar1 = isAudioStreamType(stream_coding_type);
    if (bVar1) {
      uVar2 = BitStreamReader::getBits(reader,4);
      (this->super_M2TSStreamInfo).audio_presentation_type = (uint8_t)uVar2;
      uVar2 = BitStreamReader::getBits(reader,4);
      (this->super_M2TSStreamInfo).sampling_frequency_index = (uint8_t)uVar2;
      lVar3 = -3;
      do {
        uVar2 = BitStreamReader::getBits(reader,8);
        (this->super_M2TSStreamInfo).language_code[lVar3 + 3] = (char)uVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0);
    }
    else {
      if (stream_coding_type - SUB_PGS < 2) {
        lVar3 = -3;
        do {
          uVar2 = BitStreamReader::getBits(reader,8);
          (this->super_M2TSStreamInfo).language_code[lVar3 + 3] = (char)uVar2;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0);
        (this->super_M2TSStreamInfo).language_code[3] = '\0';
        uVar2 = 8;
        goto LAB_001e07de;
      }
      if (stream_coding_type != SUB_TGS) {
        return;
      }
      uVar2 = BitStreamReader::getBits(reader,8);
      (this->super_M2TSStreamInfo).character_code = (uint8_t)uVar2;
      lVar3 = -3;
      do {
        uVar2 = BitStreamReader::getBits(reader,8);
        (this->super_M2TSStreamInfo).language_code[lVar3 + 3] = (char)uVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0);
    }
    (this->super_M2TSStreamInfo).language_code[3] = '\0';
  }
  ISRC(this,reader);
  BitStreamReader::skipBits(reader,0x20);
  return;
}

Assistant:

void CLPIStreamInfo::parseStreamCodingInfo(BitStreamReader& reader)
{
    reader.skipBits(8);  // length
    stream_coding_type = static_cast<StreamType>(reader.getBits(8));

    if (isVideoStreamType(stream_coding_type))
    {
        video_format = reader.getBits<uint8_t>(4);
        frame_rate_index = reader.getBits<uint8_t>(4);
        aspect_ratio_index = reader.getBits<uint8_t>(4);
        reader.skipBits(20);  // reserved_for_future_use, cc_flag
        ISRC(reader);
        reader.skipBits(32);  // reserved_for_future_use
    }
    else if (isAudioStreamType(stream_coding_type))
    {
        audio_presentation_type = reader.getBits<uint8_t>(4);
        sampling_frequency_index = reader.getBits<uint8_t>(4);
        readString(language_code, reader, 3);
        ISRC(reader);
        reader.skipBits(32);
    }
    else if (stream_coding_type == StreamType::SUB_PGS || stream_coding_type == StreamType::SUB_IGS)
    {
        readString(language_code, reader, 3);
        reader.skipBits(8);  // reserved_for_future_use
        ISRC(reader);
        reader.skipBits(32);  // reserved_for_future_use
    }
    else if (stream_coding_type == StreamType::SUB_TGS)
    {
        // Text subtitle stream
        character_code = reader.getBits<uint8_t>(8);
        readString(language_code, reader, 3);
        ISRC(reader);
        reader.skipBits(32);  // reserved_for_future_use
    }
}